

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.hpp
# Opt level: O1

wchar_t * boost::nowide::basic_convert<wchar_t,char>
                    (wchar_t *buffer,size_t buffer_size,char *source_begin,char *source_end)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  long lVar3;
  char *local_30;
  
  if (buffer_size == 0) {
    buffer = (wchar_t *)0x0;
  }
  else {
    lVar3 = buffer_size - 1;
    pwVar2 = buffer;
    local_30 = source_begin;
    while (local_30 != source_end) {
      wVar1 = locale::utf::utf_traits<char,1>::decode<char_const*>(&local_30,source_end);
      if (lVar3 == 0 || 0xfffffffd < (uint)wVar1) {
        buffer = (wchar_t *)0x0;
        break;
      }
      *pwVar2 = wVar1;
      pwVar2 = pwVar2 + 1;
      lVar3 = lVar3 + -1;
    }
    *pwVar2 = L'\0';
  }
  return buffer;
}

Assistant:

CharOut *basic_convert(CharOut *buffer,size_t buffer_size,CharIn const *source_begin,CharIn const *source_end)
    {
        CharOut *rv = buffer;
        if(buffer_size == 0)
            return 0;
        buffer_size --;
        while(source_begin!=source_end) {
            using namespace boost::locale::utf;
            code_point c = utf_traits<CharIn>::template decode<CharIn const *>(source_begin,source_end);
            if(c==illegal || c==incomplete) {
                rv = 0;
                break;
            }
            size_t width = utf_traits<CharOut>::width(c);
            if(buffer_size < width) {
                rv=0;
                break;
            }
            buffer = utf_traits<CharOut>::template encode<CharOut *>(c,buffer);
            buffer_size -= width;
        }
        *buffer++ = 0;
        return rv;
    }